

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::GetTrim2dStart(ON_Brep *this,int trim_index,ON_2dPoint *P)

{
  ON_BrepTrim *this_00;
  ON_BrepTrim *pOVar1;
  bool bVar2;
  double *pdVar3;
  ON_3dPoint pp;
  ON_3dPoint local_40;
  ON_Interval local_28;
  
  bVar2 = false;
  if ((-1 < trim_index) &&
     (bVar2 = false,
     trim_index <
     (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count)) {
    pOVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    this_00 = pOVar1 + (uint)trim_index;
    (*pOVar1[(uint)trim_index].super_ON_CurveProxy.super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])(this_00);
    pdVar3 = ON_Interval::operator[](&local_28,0);
    bVar2 = ON_Curve::EvPoint((ON_Curve *)this_00,*pdVar3,&local_40,0,(int *)0x0);
    if (bVar2) {
      ON_2dPoint::operator=(P,&local_40);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_Brep::GetTrim2dStart(int trim_index,
                        ON_2dPoint& P
                        ) const

{
  if (trim_index < 0 || trim_index >= m_T.Count())
    return false;
  const ON_BrepTrim& trim = m_T[trim_index];
  ON_3dPoint pp;
  if (!trim.EvPoint(trim.Domain()[0], pp)) 
    return false;
  P = pp;
  return true;
}